

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

void absl::lts_20250127::anon_unknown_1::AppendNumberUnit(string *out,double n,DisplayUnit unit)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int width;
  long v;
  double dVar4;
  char buf [15];
  double d;
  
  width = 0xf;
  if (unit.prec < 0xf) {
    width = unit.prec;
  }
  d = 0.0;
  dVar4 = modf(n,&d);
  dVar4 = round(dVar4 * unit.pow10);
  v = (long)dVar4;
  if ((long)d != 0 || v != 0) {
    pcVar2 = Format64((char *)&d,0,(long)d);
    std::__cxx11::string::append((char *)out,(ulong)pcVar2);
    if (v != 0) {
      std::__cxx11::string::push_back((char)out);
      pcVar3 = Format64((char *)&d,width,v);
      pcVar2 = buf + 0xe;
      do {
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + -1;
      } while (cVar1 == '0');
      std::__cxx11::string::append((char *)out,(ulong)pcVar3);
    }
    std::__cxx11::string::append((char *)out,(ulong)unit.abbr._M_str);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, double n, DisplayUnit unit) {
  constexpr int kBufferSize = std::numeric_limits<double>::digits10;
  const int prec = std::min(kBufferSize, unit.prec);
  char buf[kBufferSize];  // also large enough to hold integer part
  char* ep = buf + sizeof(buf);
  double d = 0;
  int64_t frac_part = std::round(std::modf(n, &d) * unit.pow10);
  int64_t int_part = d;
  if (int_part != 0 || frac_part != 0) {
    char* bp = Format64(ep, 0, int_part);  // always < 1000
    out->append(bp, static_cast<size_t>(ep - bp));
    if (frac_part != 0) {
      out->push_back('.');
      bp = Format64(ep, prec, frac_part);
      while (ep[-1] == '0') --ep;
      out->append(bp, static_cast<size_t>(ep - bp));
    }
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}